

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressPNG.cpp
# Opt level: O2

size_t __thiscall
adios2::core::compress::CompressPNG::Operate
          (CompressPNG *this,char *dataIn,Dims *blockStart,Dims *blockCount,DataType type,
          char *bufferOut)

{
  _Rb_tree_color _Var1;
  ulong uVar2;
  size_type sVar3;
  bool bVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  mapped_type *this_00;
  size_type sVar10;
  png_structp ppVar11;
  png_infop ppVar12;
  size_t sVar13;
  ulong *puVar14;
  __jmp_buf_tag *__env;
  ulong uVar15;
  long lVar16;
  unsigned_long __val;
  ulong uVar17;
  allocator local_19a;
  allocator local_199;
  int32_t local_198;
  _Rb_tree_color local_194;
  int32_t local_190;
  allocator local_189;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> rows;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  png_structp pngWrite;
  DataType local_e4;
  Dims *local_e0;
  png_infop pngInfo;
  string colorTypeStr;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *bufferOut = (this->super_Operator).m_TypeEnum;
  bufferOut[1] = '\x01';
  bufferOut[2] = '\0';
  bufferOut[3] = '\0';
  lVar16 = (long)(blockCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(blockCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  __val = lVar16 >> 3;
  if (__val - 4 < 0xfffffffffffffffe) {
    std::__cxx11::string::string((string *)&colorTypeStr,"Operator",(allocator *)&pngInfo);
    std::__cxx11::string::string((string *)&rows,"CompressPNG",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&value,"Operate",(allocator *)&local_70);
    std::__cxx11::to_string((string *)&pngWrite,__val);
    std::operator+(&local_128,"image number of dimensions ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pngWrite);
    std::operator+(&local_168,&local_128,
                   " is invalid, must be 2 {height,width*bytes_per_pixel} or 3 {height,width,bytes_per_pixel]} , in call to ADIOS2 PNG  compression"
                  );
    helper::Throw<std::invalid_argument>(&colorTypeStr,(string *)&rows,&value,&local_168,-1);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&pngWrite);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&rows);
    std::__cxx11::string::~string((string *)&colorTypeStr);
  }
  local_e4 = type;
  local_e0 = blockCount;
  std::__cxx11::string::string((string *)&colorTypeStr,"PNG_COLOR_TYPE_RGBA",(allocator *)&rows);
  p_Var9 = (this->super_Operator).m_Parameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_190 = 1;
  local_194 = 6;
  local_198 = 8;
  while ((_Rb_tree_header *)p_Var9 !=
         &(this->super_Operator).m_Parameters._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&rows,(string *)(p_Var9 + 1));
    std::__cxx11::string::string((string *)&value,(string *)(p_Var9 + 2));
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &rows,"compression_level");
    if (bVar4) {
      std::__cxx11::string::string
                ((string *)&local_168,"when setting PNG level parameter\n",(allocator *)&local_128);
      iVar5 = helper::StringTo<int>(&value,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      _Var1 = local_194;
      iVar6 = local_198;
      if (iVar5 - 10U < 0xfffffff7) {
        std::__cxx11::string::string((string *)&local_168,"Operator",(allocator *)&local_50);
        std::__cxx11::string::string((string *)&local_128,"CompressPNG",(allocator *)&local_70);
        std::__cxx11::string::string((string *)&pngWrite,"Operate",&local_199);
        std::__cxx11::string::string
                  ((string *)&pngInfo,
                   "compression_level must be an integer between 1 (less compression, less memory) and 9 (more compression, more memory) inclusive, in call to ADIOS2 PNG Compress"
                   ,&local_19a);
        helper::Throw<std::invalid_argument>
                  (&local_168,&local_128,(string *)&pngWrite,(string *)&pngInfo,-1);
        std::__cxx11::string::~string((string *)&pngInfo);
        std::__cxx11::string::~string((string *)&pngWrite);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_168);
        _Var1 = local_194;
        iVar6 = local_198;
      }
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &rows,"color_type");
      if (bVar4) {
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        *)m_ColorTypes_abi_cxx11_,&value);
        if (cVar8._M_node == (_Base_ptr)(m_ColorTypes_abi_cxx11_ + 8)) {
          std::__cxx11::string::string((string *)&local_168,"Operator",(allocator *)&local_50);
          std::__cxx11::string::string((string *)&local_128,"CompressPNG",(allocator *)&local_70);
          std::__cxx11::string::string((string *)&pngWrite,"Operate",&local_199);
          std::__cxx11::string::string
                    ((string *)&pngInfo,
                     "invalid color_type, see PNG_COLOR_TYPE_* for available types, in call to ADIOS2 PNG Compress"
                     ,&local_19a);
          helper::Throw<std::invalid_argument>
                    (&local_168,&local_128,(string *)&pngWrite,(string *)&pngInfo,-1);
          std::__cxx11::string::~string((string *)&pngInfo);
          std::__cxx11::string::~string((string *)&pngWrite);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_168);
        }
        std::__cxx11::string::_M_assign((string *)&colorTypeStr);
        _Var1 = cVar8._M_node[2]._M_color;
        iVar5 = local_190;
        iVar6 = local_198;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&rows,"bit_depth");
        _Var1 = local_194;
        iVar5 = local_190;
        iVar6 = local_198;
        if (bVar4) {
          std::__cxx11::string::string
                    ((string *)&local_168,"when setting PNG bit_depth parameter\n",
                     (allocator *)&local_128);
          iVar6 = helper::StringTo<int>(&value,&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          _Var1 = local_194;
          iVar5 = local_190;
        }
      }
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&rows);
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    local_190 = iVar5;
    local_194 = _Var1;
    local_198 = iVar6;
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                  *)m_BitDepths_abi_cxx11_,&colorTypeStr);
  rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = local_198;
  sVar10 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                     (this_00,(key_type_conflict1 *)&rows);
  if (sVar10 == 0) {
    std::__cxx11::string::string((string *)&rows,"Operator",&local_199);
    std::__cxx11::string::string((string *)&value,"CompressPNG",&local_19a);
    std::__cxx11::string::string((string *)&local_168,"Operate",&local_189);
    std::__cxx11::to_string(&local_70,local_198);
    std::operator+(&local_50,"bit_depth ",&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pngInfo,
                   &local_50," and color_type ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pngWrite,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pngInfo,
                   &colorTypeStr);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pngWrite,
                   " combination is not allowed by libpng, in call to ADIOS2 PNG compression");
    helper::Throw<std::invalid_argument>((string *)&rows,&value,&local_168,&local_128,-1);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&pngWrite);
    std::__cxx11::string::~string((string *)&pngInfo);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&rows);
  }
  ppVar11 = (png_structp)png_create_write_struct("1.6.37",0,0);
  pngWrite = ppVar11;
  ppVar12 = (png_infop)png_create_info_struct(ppVar11);
  pngInfo = ppVar12;
  if (lVar16 == 0x18) {
    puVar14 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar13 = (size_t)(uint)puVar14[2];
  }
  else {
    sVar13 = helper::GetDataTypeSize(local_e4);
    puVar14 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  }
  uVar17 = *puVar14;
  uVar2 = puVar14[1];
  png_set_IHDR(ppVar11,ppVar12,uVar2 & 0xffffffff,uVar17,local_198,local_194,0,0,0);
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar11,longjmp,200);
  iVar7 = _setjmp(__env);
  if (iVar7 != 0) {
    std::__cxx11::string::string((string *)&rows,"Operator",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&value,"CompressPNG",(allocator *)&local_70);
    std::__cxx11::string::string((string *)&local_168,"Operate",&local_199);
    std::__cxx11::string::string
              ((string *)&local_128,"libpng detected an error in ADIOS2 PNG Compress",&local_19a);
    helper::Throw<std::invalid_argument>((string *)&rows,&value,&local_168,&local_128,-1);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&rows);
  }
  png_set_compression_level(ppVar11,local_190);
  uVar17 = uVar17 & 0xffffffff;
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
            (&rows,uVar17,(allocator_type *)&value);
  for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
    *(char **)(CONCAT44(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int32_t)rows.
                                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) + uVar15 * 8) = dataIn;
    dataIn = dataIn + (sVar13 & 0xffffffff) * (uVar2 & 0xffffffff);
  }
  png_set_rows(ppVar11,ppVar12,
               CONCAT44(rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        (int32_t)rows.
                                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start));
  value._M_string_length = 0xf;
  value._M_dataplus._M_p = bufferOut;
  png_set_write_fn(ppVar11,&value,Operate::anon_class_1_0_00000001::__invoke,0);
  png_write_png(ppVar11,ppVar12,0,0);
  png_write_end(ppVar11,ppVar12);
  png_destroy_write_struct(&pngWrite,&pngInfo);
  sVar3 = value._M_string_length;
  *(size_type *)(bufferOut + 4) = value._M_string_length;
  bufferOut[0xc] = '\x01';
  bufferOut[0xd] = '\x06';
  bufferOut[0xe] = '%';
  std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
            (&rows.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
  std::__cxx11::string::~string((string *)&colorTypeStr);
  return sVar3;
}

Assistant:

size_t CompressPNG::Operate(const char *dataIn, const Dims &blockStart, const Dims &blockCount,
                            const DataType type, char *bufferOut)
{
    size_t bufferOutOffset = 0;
    const uint8_t bufferVersion = 1;

    MakeCommonHeader(bufferOut, bufferOutOffset, bufferVersion);

    size_t paramOffset = bufferOutOffset;
    bufferOutOffset += sizeof(size_t) + 3;

    auto lf_Write = [](png_structp png_ptr, png_bytep data, png_size_t length) {
        DestInfo *pDestInfo = reinterpret_cast<DestInfo *>(png_get_io_ptr(png_ptr));
        std::memcpy(pDestInfo->BufferOut + pDestInfo->Offset, data, length);
        pDestInfo->Offset += length;
    };

    const std::size_t ndims = blockCount.size();

    if (ndims != 3 && ndims != 2)
    {
        helper::Throw<std::invalid_argument>(
            "Operator", "CompressPNG", "Operate",
            "image number of dimensions " + std::to_string(ndims) +
                " is invalid, must be 2 {height,width*bytes_per_pixel} or 3"
                " {height,width,bytes_per_pixel]} , in call to ADIOS2 PNG "
                " compression");
    }

    // defaults
    int compressionLevel = 1;
    int colorType = PNG_COLOR_TYPE_RGBA;
    int bitDepth = 8;
    std::string colorTypeStr = "PNG_COLOR_TYPE_RGBA";

    for (const auto &itParameter : m_Parameters)
    {
        const std::string key = itParameter.first;
        const std::string value = itParameter.second;

        if (key == "compression_level")
        {
            compressionLevel = static_cast<int>(
                helper::StringTo<int32_t>(value, "when setting PNG level parameter\n"));

            if (compressionLevel < 1 || compressionLevel > 9)
            {
                helper::Throw<std::invalid_argument>(
                    "Operator", "CompressPNG", "Operate",
                    "compression_level must be an "
                    "integer between 1 (less "
                    "compression, less memory) and 9 "
                    "(more compression, more memory) inclusive, in call to "
                    "ADIOS2 PNG Compress");
            }
        }
        else if (key == "color_type")
        {
            auto itColorType = m_ColorTypes.find(value);

            if (itColorType == m_ColorTypes.end())
            {
                helper::Throw<std::invalid_argument>(
                    "Operator", "CompressPNG", "Operate",
                    "invalid color_type, see PNG_COLOR_TYPE_* for "
                    "available types, in call to ADIOS2 PNG Compress");
            }

            colorTypeStr = itColorType->first;
            colorType = itColorType->second;
        }
        else if (key == "bit_depth")
        {
            bitDepth = static_cast<int>(
                helper::StringTo<int32_t>(value, "when setting PNG bit_depth parameter\n"));
        }
    }

    if (m_BitDepths.at(colorTypeStr).count(static_cast<int32_t>(bitDepth)) == 0)
    {
        helper::Throw<std::invalid_argument>(
            "Operator", "CompressPNG", "Operate",
            "bit_depth " + std::to_string(bitDepth) + " and color_type " + colorTypeStr +
                " combination is not allowed by libpng, in call to ADIOS2 PNG "
                "compression");
    }

    png_structp pngWrite =
        png_create_write_struct(PNG_LIBPNG_VER_STRING, nullptr, nullptr, nullptr);
    png_infop pngInfo = png_create_info_struct(pngWrite);

    const uint32_t bytesPerPixel = ndims == 3
                                       ? static_cast<uint32_t>(blockCount[2])
                                       : static_cast<uint32_t>(helper::GetDataTypeSize(type));

    const uint32_t width = static_cast<uint32_t>(blockCount[1]);
    const uint32_t height = static_cast<uint32_t>(blockCount[0]);

    png_set_IHDR(pngWrite, pngInfo, width, height, bitDepth, colorType, PNG_INTERLACE_NONE,
                 PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    if (setjmp(png_jmpbuf(pngWrite)))
    {
        helper::Throw<std::invalid_argument>("Operator", "CompressPNG", "Operate",
                                             "libpng detected an error in ADIOS2 PNG Compress");
    }

    png_set_compression_level(pngWrite, compressionLevel);

    // set the rows
    std::vector<uint8_t *> rows(height);
    for (size_t r = 0; r < height; ++r)
    {
        rows[r] =
            reinterpret_cast<uint8_t *>(const_cast<char *>(dataIn)) + r * width * bytesPerPixel;
    }
    png_set_rows(pngWrite, pngInfo, rows.data());

    DestInfo destInfo;
    destInfo.BufferOut = bufferOut;
    destInfo.Offset = bufferOutOffset;

    png_set_write_fn(pngWrite, &destInfo, lf_Write, nullptr);
    png_write_png(pngWrite, pngInfo, PNG_TRANSFORM_IDENTITY, nullptr);
    png_write_end(pngWrite, pngInfo);

    // const size_t compressedSize = png_get_compression_buffer_size(pngWrite);
    png_destroy_write_struct(&pngWrite, &pngInfo);

    PutParameter(bufferOut, paramOffset, destInfo.Offset);
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_MAJOR));
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_MINOR));
    PutParameter(bufferOut, paramOffset, static_cast<uint8_t>(PNG_LIBPNG_VER_RELEASE));

    return destInfo.Offset;
}